

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::anon_unknown_1::CoordFragmentShader::shadeFragments
          (CoordFragmentShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  Vec4 color3;
  Vec4 color2;
  Vec4 color1;
  Vec4 color0;
  Vec4 vtxColor0;
  Vec4 vtxColor3;
  Vec4 vtxColor2;
  Vec4 vtxColor1;
  
  uVar8 = 0;
  uVar5 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar5 = uVar8;
  }
  for (; uVar5 << 2 != uVar8; uVar8 = uVar8 + 4) {
    rr::readVarying<float>((rr *)&vtxColor0,packets,context,0,0);
    rr::readVarying<float>((rr *)&vtxColor1,packets,context,0,1);
    rr::readVarying<float>((rr *)&vtxColor2,packets,context,0,2);
    rr::readVarying<float>((rr *)&vtxColor3,packets,context,0,3);
    tcu::Vector<float,_4>::Vector(&color0,&vtxColor0);
    tcu::Vector<float,_4>::Vector(&color1,(Vector<float,_4> *)&vtxColor1);
    tcu::Vector<float,_4>::Vector(&color2,(Vector<float,_4> *)&vtxColor2);
    tcu::Vector<float,_4>::Vector(&color3,(Vector<float,_4> *)&vtxColor3);
    pGVar1 = context->outputArray;
    iVar3 = context->numFragmentOutputs;
    iVar2 = (int)uVar8;
    iVar4 = (iVar2 + 1) * iVar3;
    iVar6 = (iVar2 + 2) * iVar3;
    iVar7 = (iVar2 + 3) * iVar3;
    iVar3 = iVar3 * iVar2;
    *(ulong *)&pGVar1[iVar3].v =
         CONCAT44(color0.m_data[1] * color0.m_data[3],color0.m_data[3] * color0.m_data[0]);
    pGVar1[iVar3].v.fData[2] = color0.m_data[2] * color0.m_data[3];
    pGVar1[iVar3].v.uData[3] = 0x3f800000;
    *(ulong *)&pGVar1[iVar4].v =
         CONCAT44(color1.m_data[1] * color1.m_data[3],color1.m_data[3] * color1.m_data[0]);
    pGVar1[iVar4].v.fData[2] = color1.m_data[2] * color1.m_data[3];
    pGVar1[iVar4].v.uData[3] = 0x3f800000;
    *(ulong *)&pGVar1[iVar6].v =
         CONCAT44(color2.m_data[1] * color2.m_data[3],color2.m_data[3] * color2.m_data[0]);
    pGVar1[iVar6].v.fData[2] = color2.m_data[2] * color2.m_data[3];
    pGVar1[iVar6].v.uData[3] = 0x3f800000;
    *(ulong *)&pGVar1[iVar7].v =
         CONCAT44(color3.m_data[1] * color3.m_data[3],color3.m_data[3] * color3.m_data[0]);
    pGVar1[iVar7].v.fData[2] = color3.m_data[2] * color3.m_data[3];
    pGVar1[iVar7].v.uData[3] = 0x3f800000;
    packets = packets + 1;
  }
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		for (int packetNdx = 0; packetNdx < numPackets; packetNdx++)
		{
			rr::FragmentPacket&	packet		= packets[packetNdx];

			const tcu::Vec4		vtxColor0	= rr::readVarying<float>(packet, context, 0, 0);
			const tcu::Vec4		vtxColor1	= rr::readVarying<float>(packet, context, 0, 1);
			const tcu::Vec4		vtxColor2	= rr::readVarying<float>(packet, context, 0, 2);
			const tcu::Vec4		vtxColor3	= rr::readVarying<float>(packet, context, 0, 3);

			const tcu::Vec4		color0		= vtxColor0;
			const tcu::Vec4		color1		= vtxColor1;
			const tcu::Vec4		color2		= vtxColor2;
			const tcu::Vec4		color3		= vtxColor3;

			rr::writeFragmentOutput(context, packetNdx, 0, 0, tcu::Vec4(color0.x() * color0.w(), color0.y() * color0.w(), color0.z() * color0.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 1, 0, tcu::Vec4(color1.x() * color1.w(), color1.y() * color1.w(), color1.z() * color1.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 2, 0, tcu::Vec4(color2.x() * color2.w(), color2.y() * color2.w(), color2.z() * color2.w(), 1.0f));
			rr::writeFragmentOutput(context, packetNdx, 3, 0, tcu::Vec4(color3.x() * color3.w(), color3.y() * color3.w(), color3.z() * color3.w(), 1.0f));
		}
	}